

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O3

void icons_to_property(Fl_RGB_Image **icons,int count,unsigned_long **property,size_t *len)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fl_RGB_Image *pFVar5;
  ulong uVar6;
  unsigned_long *puVar7;
  int iVar8;
  long lVar9;
  byte *pbVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  unsigned_long uVar14;
  
  if (count < 1) {
    puVar7 = (unsigned_long *)operator_new__(0);
    *property = puVar7;
    *len = 0;
  }
  else {
    uVar6 = 0;
    uVar13 = 0;
    do {
      uVar13 = uVar13 + (long)((icons[uVar6]->super_Fl_Image).h_ * (icons[uVar6]->super_Fl_Image).w_
                              + 2);
      uVar6 = uVar6 + 1;
    } while ((uint)count != uVar6);
    puVar7 = (unsigned_long *)operator_new__(-(ulong)(uVar13 >> 0x3d != 0) | uVar13 * 8);
    *property = puVar7;
    *len = uVar13;
    if (0 < count) {
      uVar6 = 0;
      do {
        pFVar5 = icons[uVar6];
        iVar2 = (pFVar5->super_Fl_Image).w_;
        *puVar7 = (long)iVar2;
        iVar3 = (pFVar5->super_Fl_Image).h_;
        puVar7[1] = (long)iVar3;
        iVar11 = (pFVar5->super_Fl_Image).ld_;
        if (iVar11 == 0) {
          lVar9 = 0;
        }
        else {
          lVar9 = (long)(iVar11 - (pFVar5->super_Fl_Image).d_ * iVar2);
        }
        puVar7 = puVar7 + 2;
        if (0 < iVar3) {
          pbVar10 = (byte *)*(pFVar5->super_Fl_Image).data_;
          iVar11 = 0;
          do {
            if (0 < iVar2) {
              iVar4 = (pFVar5->super_Fl_Image).d_;
              iVar8 = iVar2;
              do {
                switch(iVar4) {
                case 1:
                  uVar12 = (uint)*pbVar10 * 0x10101;
                  goto LAB_0019049c;
                case 2:
                  bVar1 = *pbVar10;
                  uVar14 = (long)(int)((uint)pbVar10[1] << 0x18) | (ulong)bVar1 << 0x10 |
                           (ulong)bVar1 << 8 | (ulong)bVar1;
                  break;
                case 3:
                  uVar12 = (uint)pbVar10[2] | (uint)pbVar10[1] << 8 | (uint)*pbVar10 << 0x10;
LAB_0019049c:
                  uVar14 = (ulong)uVar12 | 0xffffffffff000000;
                  break;
                case 4:
                  uVar14 = (ulong)pbVar10[2] |
                           (ulong)pbVar10[1] << 8 |
                           (long)(int)((uint)pbVar10[3] << 0x18) | (ulong)*pbVar10 << 0x10;
                  break;
                default:
                  goto switchD_00190473_default;
                }
                *puVar7 = uVar14;
switchD_00190473_default:
                pbVar10 = pbVar10 + iVar4;
                puVar7 = puVar7 + 1;
                iVar8 = iVar8 + -1;
              } while (iVar8 != 0);
            }
            pbVar10 = pbVar10 + lVar9;
            iVar11 = iVar11 + 1;
          } while (iVar11 != iVar3);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uint)count);
    }
  }
  return;
}

Assistant:

static void icons_to_property(const Fl_RGB_Image *icons[], int count,
                              unsigned long **property, size_t *len) {
  size_t sz;
  unsigned long *data;

  sz = 0;
  for (int i = 0;i < count;i++)
    sz += 2 + icons[i]->w() * icons[i]->h();

  // FIXME: Might want to sort the icons

  *property = data = new unsigned long[sz];
  *len = sz;

  for (int i = 0;i < count;i++) {
    const Fl_RGB_Image *image;

    image = icons[i];

    data[0] = image->w();
    data[1] = image->h();
    data += 2;

    const int extra_data = image->ld() ? (image->ld()-image->w()*image->d()) : 0;

    const uchar *in = (const uchar*)*image->data();
    for (int y = 0; y < image->h(); y++) {
      for (int x = 0; x < image->w(); x++) {
        switch (image->d()) {
        case 1:
          *data = ( 0xff<<24) | (in[0]<<16) | (in[0]<<8) | in[0];
          break;
        case 2:
          *data = (in[1]<<24) | (in[0]<<16) | (in[0]<<8) | in[0];
          break;
        case 3:
          *data = ( 0xff<<24) | (in[0]<<16) | (in[1]<<8) | in[2];
          break;
        case 4:
          *data = (in[3]<<24) | (in[0]<<16) | (in[1]<<8) | in[2];
          break;
        }
        in += image->d();
        data++;
      }
      in += extra_data;
    }
  }
}